

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::Texture2DMipmapCase::iterate(Texture2DMipmapCase *this)

{
  CoordType CVar1;
  code *pcVar2;
  RenderContext *context;
  int iVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  Texture2D *this_00;
  undefined4 extraout_var_00;
  char *pcVar8;
  NotSupportedError *this_01;
  Texture2D *pTVar9;
  TextureFormat *pTVar10;
  reference pvVar11;
  undefined4 extraout_var_01;
  PixelFormat *format;
  qpWatchDog *watchDog;
  TestLog *pTVar12;
  MessageBuilder *pMVar13;
  Texture2DView TVar14;
  int local_934;
  int local_930;
  bool local_929;
  int local_8f4;
  int local_8f0;
  allocator<char> local_899;
  undefined1 local_898 [6];
  bool isOk;
  allocator<char> local_871;
  string local_870;
  LogImage local_850;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  LogImage local_770;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  LogImage local_690;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  LogImageSet local_5b0;
  MessageBuilder local_570;
  Texture2DView local_3f0;
  PixelBufferAccess local_3e0;
  PixelBufferAccess local_3b8;
  PixelBufferAccess local_390;
  ConstPixelBufferAccess local_368;
  PixelBufferAccess local_340;
  ConstPixelBufferAccess local_318;
  Texture2DView local_2f0;
  SurfaceAccess local_2e0;
  int local_2c0;
  int local_2bc;
  int cellNdx_1;
  int curH_1;
  int curW_1;
  int curY_1;
  int curX_1;
  int gridX_1;
  int gridY_1;
  Vector<int,_4> local_290;
  Vector<int,_4> local_280;
  IVec4 local_270;
  tcu local_260 [8];
  float afStack_258 [2];
  Vector<int,_3> local_250;
  Vector<int,_3> local_244;
  int local_238;
  undefined1 local_234 [4];
  int numFailedPixels;
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  Surface errorMask;
  Surface referenceFrame;
  bool isTrilinear;
  PixelFormat *pixelFormat;
  int local_18c;
  int local_188;
  int cellNdx;
  int curH;
  int curW;
  int curY;
  int curX;
  int gridX;
  int gridY;
  Sampler local_168;
  int local_12c;
  int local_128;
  int cellHeight;
  int cellWidth;
  int gridHeight;
  int gridWidth;
  undefined1 local_110 [8];
  Surface renderedFrame;
  undefined1 local_f0 [6];
  bool useLodBias;
  bool isProjected;
  vector<float,_std::allocator<float>_> texCoord;
  ReferenceParams sampleParams;
  RandomViewport viewport;
  int defViewportHeight;
  int defViewportWidth;
  int texHeight;
  int texWidth;
  deUint32 magFilter;
  Texture2D *refTexture;
  Functions *gl;
  Texture2DMipmapCase *this_local;
  long lVar7;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  this_00 = glu::Texture2D::getRefTexture(this->m_texture);
  iVar3 = tcu::Texture2D::getWidth(this_00);
  iVar4 = tcu::Texture2D::getHeight(this_00);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pcVar8 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar8);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&sampleParams.baseLevel,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar5),iVar3 << 2,iVar4 << 2,dVar6);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TEXTURETYPE_2D);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f0);
  renderedFrame.m_pixels.m_cap._7_1_ = this->m_coordType == COORDTYPE_PROJECTED;
  renderedFrame.m_pixels.m_cap._6_1_ = this->m_coordType == COORDTYPE_BASIC_BIAS;
  tcu::Surface::Surface((Surface *)local_110,viewport.x,viewport.y);
  cellWidth = 4;
  cellHeight = 4;
  local_128 = viewport.x / 4;
  local_12c = viewport.y / 4;
  if ((viewport.x < (iVar3 << 2) / 2) || (viewport.y < (iVar4 << 2) / 2)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
               ,0x116);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  glu::mapGLSampler(&local_168,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  tcu::Sampler::operator=
            ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_168);
  pTVar9 = glu::Texture2D::getRefTexture(this->m_texture);
  pTVar10 = tcu::TextureLevelPyramid::getFormat(&pTVar9->super_TextureLevelPyramid);
  _gridX = *pTVar10;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = glu::TextureTestUtil::getSamplerType(_gridX);
  sampleParams.super_RenderParams.texType =
       (renderedFrame.m_pixels.m_cap._7_1_ & 1) + (renderedFrame.m_pixels.m_cap._6_1_ & 1) * 2;
  sampleParams.sampler.seamlessCubeMap = false;
  sampleParams.sampler._53_3_ = 0;
  (*this->m_texture->_vptr_Texture2D[2])();
  pcVar2 = *(code **)(lVar7 + 0xb8);
  dVar6 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar2)(0xde1,dVar6);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2600);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x128);
  if ((iterate()::s_projections == '\0') &&
     (iVar3 = __cxa_guard_acquire(&iterate()::s_projections), iVar3 != 0)) {
    tcu::Vector<float,_4>::Vector(iterate::s_projections,1.2,1.0,0.7,1.0);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 1,1.3,0.8,0.6,2.0);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 2,0.8,1.0,1.7,0.6);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 3,1.2,1.0,1.7,1.5);
    __cxa_guard_release(&iterate()::s_projections);
  }
  curX = 0;
  do {
    if (cellHeight <= curX) {
      context = this->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)&pixelFormat,(Surface *)local_110);
      glu::readPixels(context,sampleParams.baseLevel,sampleParams.maxLevel,
                      (PixelBufferAccess *)&pixelFormat);
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      format = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
      local_929 = true;
      if (this->m_minFilter != 0x2702) {
        local_929 = this->m_minFilter == 0x2703;
      }
      tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,viewport.x,viewport.y);
      tcu::Surface::Surface((Surface *)&lookupPrec.colorMask,viewport.x,viewport.y);
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
      tcu::LodPrecision::LodPrecision((LodPrecision *)local_234,RULE_OPENGL);
      local_238 = 0;
      tcu::Vector<int,_3>::Vector(&local_244,0x14,0x14,0);
      lookupPrec.coordBits.m_data[0] = local_244.m_data[2];
      lodPrec.derivateBits = local_244.m_data[0];
      lodPrec.lodBits = local_244.m_data[1];
      tcu::Vector<int,_3>::Vector(&local_250,0x10,0x10,0);
      lookupPrec.uvwBits.m_data[0] = local_250.m_data[2];
      lookupPrec.coordBits.m_data[1] = local_250.m_data[0];
      lookupPrec.coordBits.m_data[2] = local_250.m_data[1];
      glu::TextureTestUtil::getBitsVec((TextureTestUtil *)&local_290,format);
      tcu::operator-((tcu *)&local_280,&local_290,local_929 + 1);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&gridY_1,0);
      tcu::max<int,4>((tcu *)&local_270,&local_280,(Vector<int,_4> *)&gridY_1);
      tcu::computeFixedPointThreshold(local_260,&local_270);
      lookupPrec.uvwBits.m_data._4_8_ = local_260;
      lookupPrec.colorThreshold.m_data[0] = afStack_258[0];
      lookupPrec.colorThreshold.m_data[1] = afStack_258[1];
      glu::TextureTestUtil::getCompareMask((TextureTestUtil *)&gridX_1,format);
      lookupPrec.colorThreshold.m_data[2] = (float)gridX_1;
      numFailedPixels = 10;
      lodPrec.rule = 8;
      if ((renderedFrame.m_pixels.m_cap._7_1_ & 1) != 0) {
        lodPrec.rule = 6;
      }
      curX_1 = 0;
      do {
        if (cellHeight <= curX_1) {
          if (0 < local_238) {
            pTVar12 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_570,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar13 = tcu::MessageBuilder::operator<<
                                (&local_570,
                                 (char (*) [41])"ERROR: Image verification failed, found ");
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_238);
            pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [17])" invalid pixels!");
            tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_570);
          }
          pTVar12 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5d0,"Result",&local_5d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5f8,"Verification result",&local_5f9);
          tcu::LogImageSet::LogImageSet(&local_5b0,&local_5d0,&local_5f8);
          pTVar12 = tcu::TestLog::operator<<(pTVar12,&local_5b0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6b0,"Rendered",&local_6b1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6d8,"Rendered image",&local_6d9);
          tcu::LogImage::LogImage
                    (&local_690,&local_6b0,&local_6d8,(Surface *)local_110,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(pTVar12,&local_690);
          tcu::LogImage::~LogImage(&local_690);
          std::__cxx11::string::~string((string *)&local_6d8);
          std::allocator<char>::~allocator(&local_6d9);
          std::__cxx11::string::~string((string *)&local_6b0);
          std::allocator<char>::~allocator(&local_6b1);
          tcu::LogImageSet::~LogImageSet(&local_5b0);
          std::__cxx11::string::~string((string *)&local_5f8);
          std::allocator<char>::~allocator(&local_5f9);
          std::__cxx11::string::~string((string *)&local_5d0);
          std::allocator<char>::~allocator(&local_5d1);
          if (0 < local_238) {
            pTVar12 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_790,"Reference",&local_791);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7b8,"Ideal reference",&local_7b9);
            tcu::LogImage::LogImage
                      (&local_770,&local_790,&local_7b8,(Surface *)&errorMask.m_pixels.m_cap,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            pTVar12 = tcu::TestLog::operator<<(pTVar12,&local_770);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_870,"ErrorMask",&local_871);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_898,"Error mask",&local_899);
            tcu::LogImage::LogImage
                      (&local_850,&local_870,(string *)local_898,(Surface *)&lookupPrec.colorMask,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::TestLog::operator<<(pTVar12,&local_850);
            tcu::LogImage::~LogImage(&local_850);
            std::__cxx11::string::~string((string *)local_898);
            std::allocator<char>::~allocator(&local_899);
            std::__cxx11::string::~string((string *)&local_870);
            std::allocator<char>::~allocator(&local_871);
            tcu::LogImage::~LogImage(&local_770);
            std::__cxx11::string::~string((string *)&local_7b8);
            std::allocator<char>::~allocator(&local_7b9);
            std::__cxx11::string::~string((string *)&local_790);
            std::allocator<char>::~allocator(&local_791);
          }
          pTVar12 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(pTVar12,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
          pcVar8 = "Image verification failed";
          if (local_238 == 0) {
            pcVar8 = "Pass";
          }
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestNode.m_testCtx,
                     (byte)~(local_238 == 0) & QP_TEST_RESULT_FAIL,pcVar8);
          tcu::Surface::~Surface((Surface *)&lookupPrec.colorMask);
          tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
          tcu::Surface::~Surface((Surface *)local_110);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_f0);
          return STOP;
        }
        for (curY_1 = 0; curY_1 < cellWidth; curY_1 = curY_1 + 1) {
          curW_1 = local_128 * curY_1;
          curH_1 = local_12c * curX_1;
          if (curY_1 + 1 == cellWidth) {
            local_930 = viewport.x - curW_1;
          }
          else {
            local_930 = local_128;
          }
          cellNdx_1 = local_930;
          if (curX_1 + 1 == cellHeight) {
            local_934 = viewport.y - curH_1;
          }
          else {
            local_934 = local_12c;
          }
          local_2bc = local_934;
          local_2c0 = curX_1 * cellWidth + curY_1;
          CVar1 = this->m_coordType;
          if (CVar1 < COORDTYPE_AFFINE) {
LAB_019638cc:
            getBasicTexCoord2D((vector<float,_std::allocator<float>_> *)local_f0,local_2c0);
          }
          else if (CVar1 == COORDTYPE_AFFINE) {
            getAffineTexCoord2D((vector<float,_std::allocator<float>_> *)local_f0,local_2c0);
          }
          else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_019638cc;
          if ((renderedFrame.m_pixels.m_cap._7_1_ & 1) != 0) {
            sampleParams.super_RenderParams.samplerType =
                 (SamplerType)iterate::s_projections[local_2c0 % 4].m_data[0];
            sampleParams.super_RenderParams.flags =
                 (deUint32)iterate::s_projections[local_2c0 % 4].m_data[1];
            sampleParams.super_RenderParams.w.m_data._0_8_ =
                 *(undefined8 *)(iterate::s_projections[local_2c0 % 4].m_data + 2);
          }
          if ((renderedFrame.m_pixels.m_cap._6_1_ & 1) != 0) {
            sampleParams.super_RenderParams.w.m_data[2] = iterate::s_bias[local_2c0 % 8];
          }
          tcu::SurfaceAccess::SurfaceAccess
                    (&local_2e0,(Surface *)&errorMask.m_pixels.m_cap,format,curW_1,curH_1,cellNdx_1,
                     local_2bc);
          TVar14 = tcu::Texture2D::operator_cast_to_Texture2DView(this_00);
          local_2f0.m_levels = TVar14.m_levels;
          local_2f0.m_numLevels = TVar14.m_numLevels;
          pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_f0,0);
          glu::TextureTestUtil::sampleTexture
                    (&local_2e0,&local_2f0,pvVar11,
                     (ReferenceParams *)
                     &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          tcu::Surface::getAccess(&local_340,(Surface *)local_110);
          tcu::getSubregion((PixelBufferAccess *)&local_318,&local_340,curW_1,curH_1,cellNdx_1,
                            local_2bc);
          tcu::Surface::getAccess(&local_390,(Surface *)&errorMask.m_pixels.m_cap);
          tcu::getSubregion((PixelBufferAccess *)&local_368,&local_390,curW_1,curH_1,cellNdx_1,
                            local_2bc);
          tcu::Surface::getAccess(&local_3e0,(Surface *)&lookupPrec.colorMask);
          tcu::getSubregion(&local_3b8,&local_3e0,curW_1,curH_1,cellNdx_1,local_2bc);
          pTVar9 = glu::Texture2D::getRefTexture(this->m_texture);
          TVar14 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar9);
          local_3f0.m_levels = TVar14.m_levels;
          local_3f0.m_numLevels = TVar14.m_numLevels;
          pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_f0,0);
          watchDog = tcu::TestContext::getWatchDog((this->super_TestCase).super_TestNode.m_testCtx);
          iVar3 = glu::TextureTestUtil::computeTextureLookupDiff
                            (&local_318,&local_368,&local_3b8,&local_3f0,pvVar11,
                             (ReferenceParams *)
                             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             (LookupPrecision *)&lodPrec.derivateBits,(LodPrecision *)local_234,
                             watchDog);
          local_238 = iVar3 + local_238;
        }
        curX_1 = curX_1 + 1;
      } while( true );
    }
    for (curY = 0; curY < cellWidth; curY = curY + 1) {
      curW = local_128 * curY;
      curH = local_12c * curX;
      if (curY + 1 == cellWidth) {
        local_8f0 = viewport.x - curW;
      }
      else {
        local_8f0 = local_128;
      }
      cellNdx = local_8f0;
      if (curX + 1 == cellHeight) {
        local_8f4 = viewport.y - curH;
      }
      else {
        local_8f4 = local_12c;
      }
      local_188 = local_8f4;
      local_18c = curX * cellWidth + curY;
      CVar1 = this->m_coordType;
      if (CVar1 < COORDTYPE_AFFINE) {
LAB_019633e2:
        getBasicTexCoord2D((vector<float,_std::allocator<float>_> *)local_f0,local_18c);
      }
      else if (CVar1 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D((vector<float,_std::allocator<float>_> *)local_f0,local_18c);
      }
      else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_019633e2;
      if ((renderedFrame.m_pixels.m_cap._7_1_ & 1) != 0) {
        sampleParams.super_RenderParams.samplerType =
             (SamplerType)iterate::s_projections[local_18c % 4].m_data[0];
        sampleParams.super_RenderParams.flags =
             (deUint32)iterate::s_projections[local_18c % 4].m_data[1];
        sampleParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)(iterate::s_projections[local_18c % 4].m_data + 2);
      }
      if ((renderedFrame.m_pixels.m_cap._6_1_ & 1) != 0) {
        sampleParams.super_RenderParams.w.m_data[2] = iterate::s_bias[local_18c % 8];
      }
      (**(code **)(lVar7 + 0x1a00))
                (sampleParams.baseLevel + curW,sampleParams.maxLevel + curH,cellNdx,local_188);
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_f0,0);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,pvVar11,
                 (RenderParams *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    curX = curX + 1;
  } while( true );
}

Assistant:

Texture2DMipmapCase::IterateResult Texture2DMipmapCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();

	const deUint32				magFilter			= GL_NEAREST;
	const int					texWidth			= refTexture.getWidth();
	const int					texHeight			= refTexture.getHeight();
	const int					defViewportWidth	= texWidth*4;
	const int					defViewportHeight	= texHeight*4;

	const RandomViewport		viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	ReferenceParams				sampleParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;

	const bool					isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool					useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	int							gridWidth			= 4;
	int							gridHeight			= 4;
	int							cellWidth			= viewport.width / gridWidth;
	int							cellHeight			= viewport.height / gridHeight;

	// Bail out if rendertarget is too small.
	if (viewport.width < defViewportWidth/2 || viewport.height < defViewportHeight/2)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampleParams.samplerType	= glu::TextureTestUtil::getSamplerType(m_texture->getRefTexture().getFormat());
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	sampleParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int		curX		= cellWidth*gridX;
			const int		curY		= cellHeight*gridY;
			const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			const int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const tcu::PixelFormat&	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				// Compute texcoord.
				switch (m_coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}